

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  ostream *poVar1;
  string *processName_local;
  Session *this_local;
  
  poVar1 = cout();
  poVar1 = std::operator<<(poVar1,"\nCatch v");
  poVar1 = Catch::operator<<(poVar1,(Version *)libraryVersion);
  std::operator<<(poVar1,"\n");
  poVar1 = cout();
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,poVar1,processName);
  poVar1 = cout();
  poVar1 = std::operator<<(poVar1,"For more detail usage please see the project docs\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void showHelp(std::string const& processName) {
			Catch::cout() << "\nCatch v" << libraryVersion << "\n";

			m_cli.usage(Catch::cout(), processName);
			Catch::cout() << "For more detail usage please see the project docs\n" << std::endl;
		}